

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ldblib.c
# Opt level: O2

int db_getuservalue(lua_State *L)

{
  int iVar1;
  lua_Integer lVar2;
  int iVar3;
  
  lVar2 = luaL_optinteger(L,2,1);
  iVar3 = 1;
  iVar1 = lua_type(L,1);
  if (iVar1 == 7) {
    iVar1 = lua_getiuservalue(L,1,(int)lVar2);
    iVar3 = 1;
    if (iVar1 != -1) {
      lua_pushboolean(L,1);
      iVar3 = 2;
    }
  }
  else {
    lua_pushnil(L);
  }
  return iVar3;
}

Assistant:

static int db_getuservalue (lua_State *L) {
  int n = (int)luaL_optinteger(L, 2, 1);
  if (lua_type(L, 1) != LUA_TUSERDATA)
    luaL_pushfail(L);
  else if (lua_getiuservalue(L, 1, n) != LUA_TNONE) {
    lua_pushboolean(L, 1);
    return 2;
  }
  return 1;
}